

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

void fits_set_region_components(SAORegion *aRgn)

{
  bool bVar1;
  ulong uVar2;
  RgnShape *pRVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  char *__dest;
  ulong uVar8;
  long lVar9;
  
  uVar2 = (ulong)(uint)aRgn->nShapes;
  if (0 < aRgn->nShapes) {
    uVar5 = 0;
    do {
      if (aRgn->Shapes[(int)uVar5].sign == '\0') {
        uVar8 = (ulong)uVar5;
        pRVar3 = aRgn->Shapes + uVar8;
        do {
          pRVar3 = pRVar3 + -1;
          if ((int)uVar8 < 2) goto LAB_001b3453;
          uVar8 = uVar8 - 1;
        } while (pRVar3->sign == '\0');
        uVar2 = (ulong)((int)uVar8 - 1);
        do {
          if (aRgn->Shapes[uVar2].sign != '\0') {
            pRVar3 = (RgnShape *)realloc(aRgn->Shapes,(long)aRgn->nShapes * 0xa8 + 0xa8);
            aRgn->Shapes = pRVar3;
            lVar9 = (long)aRgn->nShapes;
            aRgn->nShapes = aRgn->nShapes + 1;
            lVar4 = uVar2 + 1;
            if (lVar4 < lVar9) {
              lVar6 = lVar9 * 0xa8;
              do {
                __dest = &aRgn->Shapes->sign + lVar6;
                memcpy(__dest,__dest + -0xa8,0xa8);
                lVar9 = lVar9 + -1;
                lVar6 = lVar6 + -0xa8;
              } while (lVar4 < lVar9);
              pRVar3 = aRgn->Shapes;
            }
            uVar5 = uVar5 + 1;
            memcpy(pRVar3 + lVar4,pRVar3 + (int)uVar5,0xa8);
          }
          bVar1 = 0 < (long)uVar2;
          uVar2 = uVar2 - 1;
        } while (bVar1);
        uVar2 = (ulong)(uint)aRgn->nShapes;
      }
LAB_001b3453:
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 < (int)uVar2);
    if (0 < (int)uVar2) {
      pRVar3 = aRgn->Shapes;
      lVar4 = 0;
      iVar7 = 0;
      do {
        iVar7 = (iVar7 + 1) - (uint)((&pRVar3->sign)[lVar4] == '\0');
        *(int *)((long)&pRVar3->comp + lVar4) = iVar7;
        lVar4 = lVar4 + 0xa8;
      } while (uVar2 * 0xa8 - lVar4 != 0);
    }
  }
  return;
}

Assistant:

void fits_set_region_components ( SAORegion *aRgn )
{
/* 
   Internal routine to turn a collection of regions read from an ascii file into
   the more complex structure that is allowed by the FITS REGION extension with
   multiple components. Regions are anded within components and ored between them
   ie for a pixel to be selected it must be selected by at least one component
   and to be selected by a component it must be selected by all that component's
   shapes.

   The algorithm is to replicate every exclude region after every include
   region before it in the list. eg reg1, reg2, -reg3, reg4, -reg5 becomes
   (reg1, -reg3, -reg5), (reg2, -reg5, -reg3), (reg4, -reg5) where the
   parentheses designate components.
*/

  int i, j, k, icomp;

/* loop round shapes */

  i = 0;
  while ( i<aRgn->nShapes ) {

    /* first do the case of an exclude region */

    if ( !aRgn->Shapes[i].sign ) {

      /* we need to run back through the list copying the current shape as
	 required. start by findin the first include shape before this exclude */

      j = i-1;
      while ( j > 0 && !aRgn->Shapes[j].sign ) j--;

      /* then go back one more shape */

      j--;

      /* and loop back through the regions */

      while ( j >= 0 ) {

	/* if this is an include region then insert a copy of the exclude
	   region immediately after it */
           
        /* Note that this makes shallow copies of a polygon's dynamically
        allocated Pts array -- the memory is shared.  This must be checked
        when freeing in fits_free_region. */

	if ( aRgn->Shapes[j].sign ) {

	  aRgn->Shapes = (RgnShape *) realloc (aRgn->Shapes,(1+aRgn->nShapes)*sizeof(RgnShape));
	  aRgn->nShapes++;
	  for (k=aRgn->nShapes-1; k>j+1; k--) aRgn->Shapes[k] = aRgn->Shapes[k-1];

	  i++;
	  aRgn->Shapes[j+1] = aRgn->Shapes[i];

	}

	j--;

      }

    }

    i++;

  }

  /* now set the component numbers */

  icomp = 0;
  for ( i=0; i<aRgn->nShapes; i++ ) {
    if ( aRgn->Shapes[i].sign ) icomp++;
    aRgn->Shapes[i].comp = icomp;

    /*
    printf("i = %d, shape = %d, sign = %d, comp = %d\n", i, aRgn->Shapes[i].shape, aRgn->Shapes[i].sign, aRgn->Shapes[i].comp);
    */

  }

  return;

}